

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fTextureSpecificationTests.cpp
# Opt level: O0

void __thiscall
deqp::gles2::Functional::TexSubImageCubeAlignCase::createTexture(TexSubImageCubeAlignCase *this)

{
  int iVar1;
  deUint32 dVar2;
  deUint32 dVar3;
  deUint32 dVar4;
  int iVar5;
  int height;
  int iVar6;
  reference pvVar7;
  int local_f4;
  int face_1;
  Vector<float,_4> local_e0;
  PixelBufferAccess local_d0;
  int local_a8;
  int local_a4;
  int rowPitch;
  int face;
  Vector<float,_4> local_90;
  PixelBufferAccess local_80;
  undefined1 local_48 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> data;
  TextureFormat TStack_28;
  deUint32 tex;
  TextureFormat fmt;
  TexSubImageCubeAlignCase *this_local;
  
  TStack_28 = (this->super_TextureSpecCase).m_texFormat;
  data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
  fmt = (TextureFormat)this;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_48);
  sglr::ContextWrapper::glGenTextures
            (&(this->super_TextureSpecCase).super_ContextWrapper,1,
             (deUint32 *)
             ((long)&data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 4));
  sglr::ContextWrapper::glBindTexture
            (&(this->super_TextureSpecCase).super_ContextWrapper,0x8513,
             data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage._4_4_);
  iVar6 = tcu::TextureFormat::getPixelSize(&stack0xffffffffffffffd8);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_48,
             (long)(iVar6 * (this->super_TextureSpecCase).m_width *
                   (this->super_TextureSpecCase).m_height));
  iVar6 = (this->super_TextureSpecCase).m_width;
  iVar1 = (this->super_TextureSpecCase).m_height;
  pvVar7 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_48,0);
  tcu::PixelBufferAccess::PixelBufferAccess(&local_80,&stack0xffffffffffffffd8,iVar6,iVar1,1,pvVar7)
  ;
  tcu::Vector<float,_4>::Vector(&local_90,0.0);
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)&rowPitch,1.0);
  tcu::fillWithComponentGradients(&local_80,&local_90,(Vec4 *)&rowPitch);
  sglr::ContextWrapper::glPixelStorei(&(this->super_TextureSpecCase).super_ContextWrapper,0xcf5,1);
  for (local_a4 = 0; local_a4 < 6; local_a4 = local_a4 + 1) {
    dVar2 = *(deUint32 *)(s_cubeMapFaces + (long)local_a4 * 4);
    dVar3 = this->m_format;
    iVar6 = (this->super_TextureSpecCase).m_width;
    iVar1 = (this->super_TextureSpecCase).m_height;
    dVar4 = this->m_dataType;
    pvVar7 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                       ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_48,0);
    sglr::ContextWrapper::glTexImage2D
              (&(this->super_TextureSpecCase).super_ContextWrapper,dVar2,0,dVar3,iVar6,iVar1,0,dVar3
               ,dVar4,pvVar7);
  }
  local_a8 = getRowPitch(&stack0xffffffffffffffd8,this->m_subW,this->m_alignment);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_48,
             (long)(local_a8 * this->m_subH));
  iVar5 = local_a8;
  iVar6 = this->m_subW;
  iVar1 = this->m_subH;
  pvVar7 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_48,0);
  tcu::PixelBufferAccess::PixelBufferAccess
            (&local_d0,&stack0xffffffffffffffd8,iVar6,iVar1,1,iVar5,0,pvVar7);
  tcu::Vector<float,_4>::Vector(&local_e0,1.0,0.0,0.0,1.0);
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)&stack0xffffffffffffff10,0.0,1.0,0.0,1.0);
  tcu::fillWithGrid(&local_d0,4,&local_e0,(Vec4 *)&stack0xffffffffffffff10);
  sglr::ContextWrapper::glPixelStorei
            (&(this->super_TextureSpecCase).super_ContextWrapper,0xcf5,this->m_alignment);
  for (local_f4 = 0; local_f4 < 6; local_f4 = local_f4 + 1) {
    dVar2 = *(deUint32 *)(s_cubeMapFaces + (long)local_f4 * 4);
    iVar6 = this->m_subX;
    iVar1 = this->m_subY;
    iVar5 = this->m_subW;
    height = this->m_subH;
    dVar3 = this->m_format;
    dVar4 = this->m_dataType;
    pvVar7 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                       ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_48,0);
    sglr::ContextWrapper::glTexSubImage2D
              (&(this->super_TextureSpecCase).super_ContextWrapper,dVar2,0,iVar6,iVar1,iVar5,height,
               dVar3,dVar4,pvVar7);
  }
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_48);
  return;
}

Assistant:

void createTexture (void)
	{
		tcu::TextureFormat	fmt			= m_texFormat;
		deUint32			tex			= 0;
		vector<deUint8>		data;

		DE_ASSERT(m_width == m_height);

		glGenTextures(1, &tex);
		glBindTexture(GL_TEXTURE_CUBE_MAP, tex);

		// Specify base level.
		data.resize(fmt.getPixelSize()*m_width*m_height);
		tcu::fillWithComponentGradients(tcu::PixelBufferAccess(fmt, m_width, m_height, 1, &data[0]), Vec4(0.0f), Vec4(1.0f));

		glPixelStorei(GL_UNPACK_ALIGNMENT, 1);
		for (int face = 0; face < tcu::CUBEFACE_LAST; face++)
			glTexImage2D(s_cubeMapFaces[face], 0, m_format, m_width, m_height, 0, m_format, m_dataType, &data[0]);

		// Re-specify subrectangle.
		int rowPitch = getRowPitch(fmt, m_subW, m_alignment);
		data.resize(rowPitch*m_subH);
		tcu::fillWithGrid(tcu::PixelBufferAccess(fmt, m_subW, m_subH, 1, rowPitch, 0, &data[0]), 4, Vec4(1.0f, 0.0f, 0.0f, 1.0f), Vec4(0.0f, 1.0f, 0.0f, 1.0f));

		glPixelStorei(GL_UNPACK_ALIGNMENT, m_alignment);
		for (int face = 0; face < tcu::CUBEFACE_LAST; face++)
			glTexSubImage2D(s_cubeMapFaces[face], 0, m_subX, m_subY, m_subW, m_subH, m_format, m_dataType, &data[0]);
	}